

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cc
# Opt level: O2

int ixxx::posix::pthread_create
              (pthread_t *__newthread,pthread_attr_t *__attr,__start_routine *__start_routine,
              void *__arg)

{
  int iVar1;
  pthread_create_error *this;
  
  iVar1 = ::pthread_create(__newthread,__attr,__start_routine,__arg);
  if (iVar1 == 0) {
    return 0;
  }
  this = (pthread_create_error *)__cxa_allocate_exception(0x20);
  pthread_create_error::sys_error(this,iVar1,(char *)0x0,ERRNO);
  __cxa_throw(this,&pthread_create_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void pthread_create(pthread_t *thread, const pthread_attr_t *attr,
                void *(*start_routine) (void *), void *arg)
        {
            int r = ::pthread_create(thread, attr, start_routine, arg);
            if (r)
                throw pthread_create_error(r);
        }